

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

void vkt::anon_unknown_0::markUndefined
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *values,BVec4 *mask,UVec2 *targetSize,UVec2 *offset,UVec2 *size)

{
  pointer pPVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pPVar5;
  byte bVar6;
  long lVar7;
  deUint32 x;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool *pbVar11;
  
  uVar2 = offset->m_data[0];
  uVar9 = offset->m_data[1];
  uVar10 = size->m_data[1] + uVar9;
  uVar3 = size->m_data[0];
  for (; uVar8 = uVar2, uVar9 < uVar10; uVar9 = uVar9 + 1) {
    for (; uVar8 < uVar3 + uVar2; uVar8 = uVar8 + 1) {
      uVar4 = targetSize->m_data[0];
      pPVar5 = (values->
               super__Vector_base<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar7 = 0;
      pbVar11 = mask->m_data;
      for (; lVar7 != 8; lVar7 = lVar7 + 2) {
        if (*pbVar11 == true) {
          bVar6 = (byte)lVar7 & 0x1f;
          pPVar1 = pPVar5 + (uVar4 * uVar9 + uVar8);
          pPVar1->m_status =
               pPVar1->m_status & ((ushort)(-2 << bVar6) | (ushort)(0xfffffffe >> 0x20 - bVar6));
        }
        pbVar11 = pbVar11 + 1;
      }
    }
  }
  return;
}

Assistant:

void markUndefined (vector<PixelValue>&	values,
					const BVec4&		mask,
					const UVec2&		targetSize,
					const UVec2&		offset,
					const UVec2&		size)
{
	DE_ASSERT(targetSize.x() * targetSize.y() == (deUint32)values.size());

	for (deUint32 y = offset.y(); y < offset.y() + size.y(); y++)
	for (deUint32 x = offset.x(); x < offset.x() + size.x(); x++)
	{
		for (int compNdx = 0; compNdx < 4; compNdx++)
		{
			if (mask[compNdx])
				values[x + y * targetSize.x()].setUndefined(compNdx);
		}
	}
}